

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::logVertexArrayState
          (MultiVertexArrayObjectTest *this,TestLog *log,VertexArrayState *state,string *msg)

{
  ostringstream *this_00;
  char *pcVar1;
  ostream *poVar2;
  int attribNdx;
  long lVar3;
  long lVar4;
  string local_358 [32];
  stringstream message;
  ostream local_328;
  undefined1 local_1b0 [384];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&message);
  poVar2 = std::operator<<(&local_328,(string *)msg);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(&local_328,"GL_ELEMENT_ARRAY_BUFFER : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,state->elementArrayBuffer);
  std::operator<<(poVar2,"\n");
  lVar4 = 0;
  for (lVar3 = 0;
      lVar3 < (int)(((long)(state->attributes).
                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(state->attributes).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x24); lVar3 = lVar3 + 1) {
    poVar2 = std::operator<<(&local_328,"attribute : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : ");
    pcVar1 = "mapped_ == GL_TRUE";
    if ((&((state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start)->enabled)[lVar4] == '\0') {
      pcVar1 = "mapped_ == GL_FALSE";
    }
    poVar2 = std::operator<<(poVar2,pcVar1 + 0xb);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_SIZE : ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)&((state->attributes).
                                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->size +
                                       lVar4));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)&((state->attributes).
                                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->stride +
                                       lVar4));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_TYPE : ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : ");
    pcVar1 = "mapped_ == GL_TRUE";
    if ((&((state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start)->normalized)[lVar4] == '\0') {
      pcVar1 = "mapped_ == GL_FALSE";
    }
    poVar2 = std::operator<<(poVar2,pcVar1 + 0xb);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : ");
    pcVar1 = "mapped_ == GL_TRUE";
    if ((&((state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start)->integer)[lVar4] == '\0') {
      pcVar1 = "mapped_ == GL_FALSE";
    }
    poVar2 = std::operator<<(poVar2,pcVar1 + 0xb);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)&((state->attributes).
                                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->divisor
                                       + lVar4));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_POINTER : ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)&((state->attributes).
                                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->offset +
                                       lVar4));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    lVar4 = lVar4 + 0x24;
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,local_358);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::stringstream::~stringstream((stringstream *)&message);
  return;
}

Assistant:

void MultiVertexArrayObjectTest::logVertexArrayState (tcu::TestLog& log, const VertexArrayState& state, const std::string& msg)
{
	std::stringstream message;

	message << msg << "\n";
	message << "GL_ELEMENT_ARRAY_BUFFER : " << state.elementArrayBuffer << "\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		message
		<< "attribute : " << attribNdx << "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : " << (state.attributes[attribNdx].enabled ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_SIZE : " << state.attributes[attribNdx].size <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : " << state.attributes[attribNdx].stride <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_TYPE : " << state.attributes[attribNdx].type <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : " << (state.attributes[attribNdx].normalized ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : " << (state.attributes[attribNdx].integer ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : " << state.attributes[attribNdx].divisor <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_POINTER : " << state.attributes[attribNdx].offset <<  "\n"
		<< "\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : " << m_buffers[state.attributes[attribNdx].bufferNdx] <<  "\n";
	}
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}